

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Token * __thiscall wabt::WastParser::GetToken(Token *__return_storage_ptr__,WastParser *this)

{
  size_t *psVar1;
  undefined8 *puVar2;
  size_type *psVar3;
  char *pcVar4;
  size_type sVar5;
  size_t sVar6;
  size_t sVar7;
  undefined8 uVar8;
  char *pcVar9;
  size_type sVar10;
  ulong uVar11;
  Token local_60;
  
  if ((this->tokens_).size_ == 0) {
    WastLexer::GetToken(&local_60,this->lexer_,this);
    CircularArray<wabt::Token,_2UL>::push_back(&this->tokens_,&local_60);
    if ((this->tokens_).size_ == 0) {
      __assert_fail("index < size_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/circular-array.h"
                    ,0x34,
                    "reference wabt::CircularArray<wabt::Token, 2>::at(size_type) [T = wabt::Token, kCapacity = 2]"
                   );
    }
  }
  uVar11 = (ulong)(((uint)(this->tokens_).front_ & 1) << 6);
  puVar2 = (undefined8 *)((long)&(this->tokens_).contents_._M_elems[0].loc.filename.data_ + uVar11);
  pcVar4 = (char *)*puVar2;
  sVar5 = puVar2[1];
  psVar1 = (size_t *)((long)&(this->tokens_).contents_._M_elems[0].loc.field_1 + uVar11);
  sVar6 = *psVar1;
  sVar7 = psVar1[1];
  puVar2 = (undefined8 *)((long)&(this->tokens_).contents_._M_elems[0].token_type_ + uVar11);
  uVar8 = *puVar2;
  pcVar9 = (char *)puVar2[1];
  psVar3 = (size_type *)((long)&(this->tokens_).contents_._M_elems[0].field_2 + uVar11 + 8);
  sVar10 = psVar3[1];
  (__return_storage_ptr__->field_2).text_.size_ = *psVar3;
  (__return_storage_ptr__->field_2).literal_.text.size_ = sVar10;
  *(undefined8 *)&__return_storage_ptr__->token_type_ = uVar8;
  (__return_storage_ptr__->field_2).text_.data_ = pcVar9;
  (__return_storage_ptr__->loc).field_1.field_1.offset = sVar6;
  *(size_t *)((long)&(__return_storage_ptr__->loc).field_1 + 8) = sVar7;
  (__return_storage_ptr__->loc).filename.data_ = pcVar4;
  (__return_storage_ptr__->loc).filename.size_ = sVar5;
  return __return_storage_ptr__;
}

Assistant:

Token WastParser::GetToken() {
  if (tokens_.empty()) {
    tokens_.push_back(lexer_->GetToken(this));
  }
  return tokens_.front();
}